

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

_Bool upb_Arena_Fuse(upb_Arena *a1,upb_Arena *a2)

{
  _Bool _Var1;
  upb_ArenaInternal *new_root_00;
  upb_ArenaInternal *new_root;
  uintptr_t ref_delta;
  upb_ArenaInternal *ai2;
  upb_ArenaInternal *ai1;
  upb_Arena *a2_local;
  upb_Arena *a1_local;
  
  if (a1 == a2) {
    a1_local._7_1_ = true;
  }
  else {
    ai1 = (upb_ArenaInternal *)a2;
    a2_local = a1;
    ai2 = upb_Arena_Internal(a1);
    ref_delta = (uintptr_t)upb_Arena_Internal((upb_Arena *)ai1);
    _Var1 = _upb_ArenaInternal_HasInitialBlock(ai2);
    if ((_Var1) ||
       (_Var1 = _upb_ArenaInternal_HasInitialBlock((upb_ArenaInternal *)ref_delta), _Var1)) {
      a1_local._7_1_ = false;
    }
    else {
      new_root = (upb_ArenaInternal *)0x0;
      do {
        do {
          new_root_00 = _upb_Arena_DoFuse(a2_local,(upb_Arena *)ai1,(uintptr_t *)&new_root);
        } while (new_root_00 == (upb_ArenaInternal *)0x0);
        _Var1 = _upb_Arena_FixupRefs(new_root_00,(uintptr_t)new_root);
      } while (!_Var1);
      a1_local._7_1_ = true;
    }
  }
  return a1_local._7_1_;
}

Assistant:

bool upb_Arena_Fuse(upb_Arena* a1, upb_Arena* a2) {
  if (a1 == a2) return true;  // trivial fuse

#ifdef UPB_TRACING_ENABLED
  upb_Arena_LogFuse(a1, a2);
#endif

  upb_ArenaInternal* ai1 = upb_Arena_Internal(a1);
  upb_ArenaInternal* ai2 = upb_Arena_Internal(a2);

  // Do not fuse initial blocks since we cannot lifetime extend them.
  // Any other fuse scenario is allowed.
  if (_upb_ArenaInternal_HasInitialBlock(ai1) ||
      _upb_ArenaInternal_HasInitialBlock(ai2)) {
    return false;
  }

  // The number of refs we ultimately need to transfer to the new root.
  uintptr_t ref_delta = 0;
  while (true) {
    upb_ArenaInternal* new_root = _upb_Arena_DoFuse(a1, a2, &ref_delta);
    if (new_root != NULL && _upb_Arena_FixupRefs(new_root, ref_delta)) {
      return true;
    }
  }
}